

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

uint Catch::rngSeed(void)

{
  int iVar1;
  uint uVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  
  pIVar3 = getCurrentMutableContext();
  iVar1 = (*(pIVar3->super_IContext)._vptr_IContext[4])(pIVar3);
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x88))
                    ((long *)CONCAT44(extraout_var,iVar1));
  return uVar2;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }